

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O0

uint8 * __thiscall
rw::ps2::MatPipeline::collectData
          (MatPipeline *this,Geometry *g,InstanceData *inst,Mesh *m,uint8 **data)

{
  uint32 uVar1;
  int iVar2;
  uint32 uVar3;
  uint8 *puVar4;
  uint32 local_130;
  uint local_118;
  uint32 asz;
  uint i_2;
  uint i_1;
  uint32 nverts;
  uint32 j;
  uint32 *p;
  uint32 overlap;
  uint8 *datap [10];
  uint local_9c;
  uint8 *puStack_98;
  uint i;
  uint8 *dp;
  uint8 *raw;
  InstMeshInfo im;
  PipeAttribute *a;
  uint8 **data_local;
  Mesh *m_local;
  InstanceData *inst_local;
  Geometry *g_local;
  MatPipeline *this_local;
  
  getInstMeshInfo((InstMeshInfo *)&raw,this,g,m);
  puVar4 = (uint8 *)mustmalloc_LOC((ulong)(im.size * m->numIndices),0x3000f,
                                   "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/ps2/ps2.cpp line: 769"
                                  );
  puStack_98 = puVar4;
  for (local_9c = 0; local_9c < 10; local_9c = local_9c + 1) {
    im.attribPos._32_8_ = this->attribs[local_9c];
    if ((PipeAttribute *)im.attribPos._32_8_ != (PipeAttribute *)0x0) {
      if ((((PipeAttribute *)im.attribPos._32_8_)->attrib & 6) == 0) {
        data[local_9c] = puStack_98;
        uVar3 = m->numIndices;
        uVar1 = attribSize(((PipeAttribute *)im.attribPos._32_8_)->attrib);
        puStack_98 = puStack_98 + uVar3 * uVar1;
      }
      else {
        data[local_9c] = inst->data + (im.attribPos[(ulong)local_9c - 2] << 4);
      }
    }
  }
  memcpy(&stack0xffffffffffffff08,data,0x50);
  iVar2 = 0;
  if (g->meshHeader->flags == 1) {
    iVar2 = 2;
  }
  _nverts = inst->data;
  if (raw._4_4_ == 0) {
    _nverts = _nverts + 0x10;
  }
  for (i_1 = 0; i_1 < im.batchVertCount; i_1 = i_1 + 1) {
    if (i_1 < im.batchVertCount - 1) {
      local_130 = im.numAttribs;
    }
    else {
      local_130 = im.numBrokenAttribs;
    }
    for (asz = 0; asz < 10; asz = asz + 1) {
      if ((this->attribs[asz] != (PipeAttribute *)0x0) && ((this->attribs[asz]->attrib & 6) != 0)) {
        _nverts = _nverts + 0x20;
      }
    }
    if (raw._4_4_ != 0) {
      _nverts = _nverts + 0x10;
    }
    for (local_118 = 0; local_118 < 10; local_118 = local_118 + 1) {
      im.attribPos._32_8_ = this->attribs[local_118];
      if (((PipeAttribute *)im.attribPos._32_8_ != (PipeAttribute *)0x0) &&
         ((((PipeAttribute *)im.attribPos._32_8_)->attrib & 6) == 0)) {
        uVar3 = attribSize(((PipeAttribute *)im.attribPos._32_8_)->attrib);
        if ((*(uint *)(_nverts + 0xc) & 0xff004000) != *(uint *)(im.attribPos._32_8_ + 8)) {
          fprintf(_stderr,"unexpected unpack: %08x %08x\n",(ulong)*(uint *)(_nverts + 0xc),
                  (ulong)*(uint *)(im.attribPos._32_8_ + 8));
        }
        memcpy(*(void **)(&stack0xffffffffffffff08 + (ulong)local_118 * 8),_nverts + 0x10,
               (ulong)(uVar3 * local_130));
        *(ulong *)(&stack0xffffffffffffff08 + (ulong)local_118 * 8) =
             *(long *)(&stack0xffffffffffffff08 + (ulong)local_118 * 8) +
             (ulong)(uVar3 * (local_130 - iVar2));
        _nverts = _nverts + 0x10 + (ulong)((uVar3 * local_130 + 0xf >> 4) << 2) * 4;
      }
    }
    _nverts = _nverts + 0x10;
  }
  return puVar4;
}

Assistant:

uint8*
MatPipeline::collectData(Geometry *g, InstanceData *inst, Mesh *m, uint8 *data[])
{
	PipeAttribute *a;
	InstMeshInfo im = getInstMeshInfo(this, g, m);

	uint8 *raw = rwNewT(uint8, im.vertexSize*m->numIndices, MEMDUR_EVENT | ID_GEOMETRY);
	uint8 *dp = raw;
	for(uint i = 0; i < nelem(this->attribs); i++)
		if((a = this->attribs[i])) {
			if(a->attrib & AT_RW){
				data[i] = inst->data + im.attribPos[i]*0x10;
			}else{
				data[i] = dp;
				dp += m->numIndices*attribSize(a->attrib);
			}
		}

	uint8 *datap[nelem(this->attribs)];
	memcpy(datap, data, sizeof(datap));

	uint32 overlap = g->meshHeader->flags == 1 ? 2 : 0;
	uint32 *p = (uint32*)inst->data;
	if(im.numBrokenAttribs == 0)
		p += 4;
	for(uint32 j = 0; j < im.numBatches; j++){
		uint32 nverts = j < im.numBatches-1 ? im.batchVertCount :
		                                      im.lastBatchVertCount;
		for(uint i = 0; i < nelem(this->attribs); i++)
			if((a = this->attribs[i]) && a->attrib & AT_RW)
				p += 8;
		if(im.numBrokenAttribs)
			p += 4;
		for(uint i = 0; i < nelem(this->attribs); i++)
			if((a = this->attribs[i]) && (a->attrib & AT_RW) == 0){
				uint32 asz = attribSize(a->attrib);
				p += 4;
				if((p[-1] & 0xff004000) != a->attrib){
					fprintf(stderr, "unexpected unpack: %08x %08x\n", p[-1], a->attrib);
					assert(0 && "unexpected unpack\n");
				}
				memcpy(datap[i], p, asz*nverts);
				datap[i] += asz*(nverts-overlap);
				p += QWC(asz*nverts)*4;
			}
		p += 4;
	}
	return raw;
}